

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall
ktx::Reporter::fatal_usage<char_const(&)[67],char_const*&,std::__cxx11::string_const&>
          (Reporter *this,char (*args) [67],char **args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  format_string<const_char_*&,_const_std::__cxx11::basic_string<char>_&> fmt;
  size_t sVar1;
  undefined8 uVar2;
  char *in_RCX;
  size_t in_RDX;
  undefined1 *puVar3;
  ReturnCode returnCode;
  FatalError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  ostream *in_stack_ffffffffffffff30;
  basic_string_view<char> in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  char *args_00;
  ostream *in_stack_ffffffffffffff60;
  
  puVar3 = &stack0xffffffffffffff58;
  args_00 = "{} fatal: ";
  sVar1 = std::char_traits<char>::length((char_type *)0x23690e);
  *(size_t *)(puVar3 + 8) = sVar1;
  returnCode = (ReturnCode)((ulong)puVar3 >> 0x20);
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff30,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff28);
  this_00 = (FatalError *)&stack0xffffffffffffff48;
  sVar1 = std::char_traits<char>::length((char_type *)0x2369ab);
  *(size_t *)&this_00->returnCode = sVar1;
  fmt.str_.size_ = in_RDX;
  fmt.str_.data_ = in_RCX;
  ::fmt::v10::print<char_const*&,std::__cxx11::string_const&>
            (in_stack_ffffffffffffff60,fmt,(char **)args_00,in_stack_ffffffffffffff50);
  sVar1 = std::char_traits<char>::length((char_type *)0x236a46);
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff30,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff28);
  uVar2 = __cxa_allocate_exception(0x10);
  FatalError::FatalError(this_00,returnCode);
  __cxa_throw(uVar2,&FatalError::typeinfo,FatalError::~FatalError);
}

Assistant:

void fatal_usage(Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, " See '{} --help'.\n", commandName);
        throw FatalError(rc::INVALID_ARGUMENTS);
    }